

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warfare_Header.h
# Opt level: O2

void __thiscall
KDIS::PDU::Warfare_Header::Warfare_Header(Warfare_Header *this,Warfare_Header *param_1)

{
  KUINT16 KVar1;
  
  Header7::Header7(&this->super_Header,&param_1->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Warfare_Header_0021eb20;
  (this->m_FiringEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00216de8;
  KVar1 = (param_1->m_FiringEntityID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->m_FiringEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (param_1->m_FiringEntityID).super_SimulationIdentifier.m_ui16SiteID;
  (this->m_FiringEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_FiringEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00216c88;
  *(undefined2 *)&(this->m_FiringEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(param_1->m_FiringEntityID).super_SimulationIdentifier.field_0xc;
  (this->m_TargetEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00216de8;
  KVar1 = (param_1->m_TargetEntityID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->m_TargetEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (param_1->m_TargetEntityID).super_SimulationIdentifier.m_ui16SiteID;
  (this->m_TargetEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_TargetEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00216c88;
  *(undefined2 *)&(this->m_TargetEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(param_1->m_TargetEntityID).super_SimulationIdentifier.field_0xc;
  (this->m_MunitionID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00216de8;
  KVar1 = (param_1->m_MunitionID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->m_MunitionID).super_SimulationIdentifier.m_ui16SiteID =
       (param_1->m_MunitionID).super_SimulationIdentifier.m_ui16SiteID;
  (this->m_MunitionID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_MunitionID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00216c88;
  *(undefined2 *)&(this->m_MunitionID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(param_1->m_MunitionID).super_SimulationIdentifier.field_0xc;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00216de8;
  KVar1 = (param_1->m_EventID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16SiteID =
       (param_1->m_EventID).super_SimulationIdentifier.m_ui16SiteID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00216c88;
  *(undefined2 *)&(this->m_EventID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(param_1->m_EventID).super_SimulationIdentifier.field_0xc;
  return;
}

Assistant:

class KDIS_EXPORT Warfare_Header : public Header
{
protected:

    KDIS::DATA_TYPE::EntityIdentifier m_FiringEntityID;

    KDIS::DATA_TYPE::EntityIdentifier m_TargetEntityID;

    KDIS::DATA_TYPE::EntityIdentifier m_MunitionID;

    KDIS::DATA_TYPE::EntityIdentifier m_EventID;

public:

    static const KUINT16 WARFARE_HEADER_SIZE = 36;

    Warfare_Header();

    Warfare_Header( const Header & H );

    Warfare_Header( const KDIS::DATA_TYPE::EntityIdentifier & FiringEntID, const KDIS::DATA_TYPE::EntityIdentifier & TargetEntID,
                    const KDIS::DATA_TYPE::EntityIdentifier & MunitionID, const KDIS::DATA_TYPE::EntityIdentifier & EventID );

    virtual ~Warfare_Header();

    //************************************
    // FullName:    KDIS::PDU::Warfare_Header::SetFiringEntityID
    //              KDIS::PDU::Warfare_Header::GetFiringEntityID
    // Description: Firing Entity.
    // Parameter:   const EntityIdentifier & ID
    //************************************
    void SetFiringEntityID( const KDIS::DATA_TYPE::EntityIdentifier & ID );
    const KDIS::DATA_TYPE::EntityIdentifier & GetFiringEntityID() const;
    KDIS::DATA_TYPE::EntityIdentifier & GetFiringEntityID();

    //************************************
    // FullName:    KDIS::PDU::Warfare_Header::SetTargetEntityID
    //              KDIS::PDU::Warfare_Header::GetTargetEntityID
    // Description: Target Entity. If target is unknown the ID
    //              shall contain the symbolic value: TARGET_ID_UNKNOWN.
    // Parameter:   const EntityIdentifier & ID
    //************************************
    void SetTargetEntityID( const KDIS::DATA_TYPE::EntityIdentifier & ID );
    const KDIS::DATA_TYPE::EntityIdentifier & GetTargetEntityID() const;
    KDIS::DATA_TYPE::EntityIdentifier & GetTargetEntityID();

    //************************************
    // FullName:    KDIS::PDU::Warfare_Header::SetMunitionID
    //              KDIS::PDU::Warfare_Header::GetMunitionID
    // Description: Munition ID. If the munition is not tracked
    //              the ID shall contain the symbolic value: MUNITION_NOT_TRACKED.
    // Parameter:   const EntityIdentifier & ID
    //************************************
    void SetMunitionID( const KDIS::DATA_TYPE::EntityIdentifier & ID );
    const KDIS::DATA_TYPE::EntityIdentifier & GetMunitionID() const;
    KDIS::DATA_TYPE::EntityIdentifier & GetMunitionID();

    //************************************
    // FullName:    KDIS::PDU::Warfare_Header::SetEventID
    //              KDIS::PDU::Warfare_Header::GetEventID
    // Description: Event ID. Used to associate related firing/detonation
    //              events. If a detonation event if not proceeded
    //              by a firing event then the value shall be 0 (e.g land mines)
    // Parameter:   const EntityIdentifier & ID
    //************************************
    void SetEventID( const KDIS::DATA_TYPE::EntityIdentifier & ID );
    const KDIS::DATA_TYPE::EntityIdentifier & GetEventID() const;
    KDIS::DATA_TYPE::EntityIdentifier & GetEventID();

    //************************************
    // FullName:    KDIS::PDU::Warfare_Header::GetAsString
    // Description: Returns a string representation of the PDU.
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::PDU::Warfare_Header::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    // Parameter:   bool ignoreHeader = false - Decode the header from the stream?
    //************************************
    virtual void Decode(KDataStream &stream, bool ignoreHeader = false) noexcept(false);

    //************************************
    // FullName:    KDIS::PDU::Warfare_Header::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const Warfare_Header & Value ) const;
    KBOOL operator != ( const Warfare_Header & Value ) const;
}